

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O1

void __thiscall MDPValueIteration::PlanSlow(MDPValueIteration *this)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PlanningUnitDecPOMDPDiscrete *this_00;
  DecPOMDPDiscreteInterface *pDVar7;
  pointer pQVar8;
  MultiAgentDecisionProcessDiscreteInterface *pMVar9;
  size_type __n;
  size_type sVar10;
  pointer puVar11;
  unsigned_long uVar12;
  unsigned_long uVar13;
  void *pvVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined8 this_01;
  undefined4 uVar17;
  undefined8 uVar18;
  double *pdVar19;
  size_t S;
  double A;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pcVar20;
  double dVar21;
  ulong uVar22;
  ulong uVar23;
  subiterator_type puVar24;
  Index ssucI;
  ulong *puVar25;
  ulong *puVar26;
  ulong uVar27;
  uint uVar28;
  char *__end;
  bool bVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 extraout_var [56];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  const_iterator2 ci;
  vector<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
  T;
  CMatrix *Ta;
  double p;
  QTable immReward;
  undefined1 local_170 [16];
  undefined1 local_160 [40];
  double local_138;
  double local_130;
  TimedAlgorithm *local_128;
  double local_120;
  ulong local_118;
  pointer local_110;
  void *local_108;
  iterator iStack_100;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  **local_f8;
  ulong local_e8;
  compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_e0;
  undefined1 local_d8 [32];
  size_type local_b8;
  double *pdStack_b0;
  subiterator_type local_a8;
  ulong local_a0;
  double local_98;
  QTable local_90;
  undefined1 local_60 [40];
  subiterator_type local_38;
  
  if (this->_m_initialized == false) {
    Initialize(this);
  }
  local_170._0_8_ = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Plan","");
  local_128 = &this->super_TimedAlgorithm;
  TimedAlgorithm::StartTimer(local_128,(string *)local_170);
  if ((undefined1 *)local_170._0_8_ != local_160) {
    operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
  }
  this_00 = (this->super_MDPSolver)._m_pu;
  local_120 = (double)(this_00->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  S = PlanningUnitMADPDiscrete::GetNrStates(&this_00->super_PlanningUnitMADPDiscrete);
  A = (double)(**(code **)((long)*(((this->super_MDPSolver)._m_pu)->super_PlanningUnitMADPDiscrete).
                                  _m_madp + 0x68))();
  QTable::QTable(&local_90,S,(size_t)A);
  if (S != 0) {
    uVar27 = 0;
    do {
      if (A != 0.0) {
        uVar28 = 1;
        dVar21 = 0.0;
        do {
          pDVar7 = ((this->super_MDPSolver)._m_pu)->_m_DecPOMDP;
          dVar31 = (double)(**(code **)(*(long *)pDVar7 + 0xc0))(pDVar7,uVar27,uVar28 - 1);
          local_90.super_matrix_t.data_.data_
          [local_90.super_matrix_t.size2_ * uVar27 + (long)dVar21] = dVar31;
          dVar21 = (double)(ulong)uVar28;
          uVar28 = uVar28 + 1;
        } while ((ulong)dVar21 < (ulong)A);
      }
      uVar27 = (ulong)((int)uVar27 + 1);
    } while (uVar27 < S);
  }
  local_160._32_8_ = this;
  if (this->_m_finiteHorizon == false) {
    pDVar7 = ((this->super_MDPSolver)._m_pu)->_m_DecPOMDP;
    local_a0 = (**(code **)(*(long *)((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0))
                           + 0x70))((long)&pDVar7->field_0x0 + *(long *)(*(long *)pDVar7 + -0xb0));
    local_b8 = 0;
    pdStack_b0 = (double *)0x0;
    local_d8._8_8_ = 0;
    local_d8._16_8_ = 0;
    local_d8._0_8_ = &PTR_Get_005cdfc0;
    local_108 = (void *)0x0;
    iStack_100._M_current =
         (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          **)0x0;
    local_f8 = (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                **)0x0;
    if (A != 0.0) {
      dVar21 = 0.0;
      do {
        local_170._0_8_ = local_160;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"CacheTransitionModel","");
        TimedAlgorithm::StartTimer(local_128,(string *)local_170);
        if ((compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)local_170._0_8_ !=
            (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)local_160) {
          operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
        }
        pcVar20 = (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)operator_new(0x70);
        boost::numeric::ublas::
        compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::compressed_matrix(pcVar20,S,S,0);
        local_e0 = pcVar20;
        if (S != 0) {
          uVar27 = 0;
          do {
            uVar28 = 1;
            uVar23 = 0;
            do {
              pMVar9 = (((MDPSolver *)local_160._32_8_)->_m_pu->super_PlanningUnitMADPDiscrete).
                       _m_madp;
              local_98 = (double)(**(code **)((long)*pMVar9 + 0x108))(pMVar9,uVar27,dVar21);
              if (0.0 < local_98) {
                local_170._0_8_ = local_e0;
                local_170._8_8_ = uVar27;
                local_160._0_8_ = uVar23;
                boost::numeric::ublas::
                sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                ::set((sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                       *)local_170,&local_98);
              }
              uVar23 = (ulong)uVar28;
              uVar28 = uVar28 + 1;
            } while (S != uVar23);
            uVar27 = (ulong)((int)uVar27 + 1);
          } while (S != uVar27);
        }
        if (iStack_100._M_current == local_f8) {
          std::
          vector<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,std::allocator<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*>>
          ::
          _M_realloc_insert<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*const&>
                    ((vector<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,std::allocator<boost::numeric::ublas::compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*>>
                      *)&local_108,iStack_100,&local_e0);
        }
        else {
          *iStack_100._M_current = local_e0;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
        this = (MDPValueIteration *)local_160._32_8_;
        local_170._0_8_ = local_160;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"CacheTransitionModel","");
        TimedAlgorithm::StopTimer(local_128,(string *)local_170);
        if ((undefined1 *)local_170._0_8_ != local_160) {
          operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
        }
        dVar21 = (double)(ulong)(SUB84(dVar21,0) + 1);
      } while (A != dVar21);
    }
    do {
      local_170._0_8_ = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Iteration","");
      TimedAlgorithm::StartTimer(local_128,(string *)local_170);
      if ((compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)local_170._0_8_ !=
          (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)local_160) {
        operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
      }
      pdVar19 = pdStack_b0;
      pQVar8 = (this->_m_QValues).super__Vector_base<QTable,_std::allocator<QTable>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_d8._8_8_ = (pQVar8->super_matrix_t).size1_;
      local_d8._16_8_ = (pQVar8->super_matrix_t).size2_;
      if ((pointer)local_d8 != pQVar8) {
        __n = (pQVar8->super_matrix_t).data_.size_;
        if (local_b8 != __n) {
          if (__n != 0) {
            pdStack_b0 = __gnu_cxx::new_allocator<double>::allocate
                                   ((new_allocator<double> *)(local_d8 + 0x18),__n,(void *)0x0);
          }
          if (local_b8 != 0) {
            operator_delete(pdVar19,local_b8 << 3);
          }
          local_b8 = __n;
          if (__n == 0) {
            pdStack_b0 = (double *)0x0;
          }
        }
        sVar10 = (pQVar8->super_matrix_t).data_.size_;
        if (sVar10 != 0) {
          memmove(pdStack_b0,(pQVar8->super_matrix_t).data_.data_,sVar10 << 3);
        }
      }
      dVar21 = 0.0;
      if (A != 0.0) {
        local_138 = 0.0;
LAB_0035e371:
        local_130 = dVar21;
        boost::numeric::ublas::
        compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::find1((iterator1 *)local_170,
                *(compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  **)((long)local_108 + (long)dVar21 * 8),0,0,0,1);
        do {
          uVar18 = local_160._16_8_;
          this_01 = local_170._0_8_;
          uVar17 = local_170._8_4_;
          local_e8 = local_160._8_8_;
          local_a8 = (subiterator_type)local_160._24_8_;
          uVar27 = local_160._0_8_;
          do {
            pcVar20 = *(compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                        **)((long)local_108 + (long)local_130 * 8);
            boost::numeric::ublas::
            compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::find1((iterator1 *)local_170,pcVar20,0,pcVar20->size1_,0,1);
            if ((uVar17 == 1) || (local_170._8_4_ == 1)) {
              bVar29 = local_a8 == (subiterator_type)local_160._24_8_;
            }
            else {
              bVar29 = local_160._8_8_ == local_e8 && local_160._0_8_ == uVar27;
            }
            if (bVar29) {
              dVar21 = (double)(ulong)(SUB84(local_130,0) + 1);
              if ((ulong)dVar21 < (ulong)A) goto LAB_0035e371;
              bVar29 = 0.0001 < local_138;
              this = (MDPValueIteration *)local_160._32_8_;
              goto LAB_0035e732;
            }
            uVar23 = uVar27;
            local_118 = uVar27;
            if (uVar17 == 1) {
              local_118 = uVar18 - (long)*(pointer *)(this_01 + 0x38) >> 3;
              uVar23 = uVar18 - (long)*(pointer *)(this_01 + 0x38) >> 3;
            }
            local_118 = local_118 & 0xffffffff;
            local_120 = local_90.super_matrix_t.data_.data_
                        [local_90.super_matrix_t.size2_ * local_118 + (long)local_130];
            boost::numeric::ublas::
            compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            ::find2((const_iterator2 *)local_170,
                    (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     *)this_01,1,uVar23,0,1);
            auVar38 = ZEXT864(0) << 0x40;
            while( true ) {
              local_110 = auVar38._0_8_;
              uVar23 = uVar27;
              if (uVar17 == 1) {
                uVar23 = uVar18 - (long)*(pointer *)(this_01 + 0x38) >> 3;
              }
              boost::numeric::ublas::
              compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              ::find2((const_iterator2 *)local_60,
                      (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       *)this_01,1,uVar23,*(size_type *)(this_01 + 8),1);
              if ((local_170._8_4_ == 1) || (local_60._8_4_ == 1)) {
                bVar29 = (subiterator_type)local_160._24_8_ == local_38;
              }
              else {
                auVar30._8_8_ = local_160._8_8_;
                auVar30._0_8_ = local_160._0_8_;
                uVar15 = vpcmpeqq_avx512vl(local_60._16_16_,auVar30);
                bVar29 = ((byte)uVar15 & 3) == 3;
              }
              auVar36._8_8_ = 0;
              auVar36._0_8_ = local_110;
              if (bVar29) break;
              puVar24 = (subiterator_type)(local_160 + 8);
              if (local_170._8_4_ == 1) {
                puVar24 = (subiterator_type)local_160._24_8_;
              }
              uVar23 = 0;
              auVar30 = ZEXT816(0xffefffffffffffff);
              do {
                auVar4._8_8_ = 0;
                auVar4._0_8_ = pdStack_b0[(ulong)(uint)*puVar24 * local_d8._16_8_ + uVar23];
                auVar30 = vmaxsd_avx(auVar30,auVar4);
                uVar23 = uVar23 + 1;
              } while ((uVar23 & 0xffffffff) < (ulong)A);
              if (local_170._8_4_ == 1) {
                puVar25 = (ulong *)((local_160._24_8_ - (long)*(pointer *)(local_170._0_8_ + 0x50))
                                   + (long)*(pointer *)(local_170._0_8_ + 0x68));
              }
              else {
                if (local_160._0_8_ + 1 < *(array_size_type *)(local_170._0_8_ + 0x18)) {
                  puVar11 = *(pointer *)(local_170._0_8_ + 0x50);
                  uVar12 = (*(pointer *)(local_170._0_8_ + 0x38))[local_160._0_8_];
                  uVar13 = (*(pointer *)(local_170._0_8_ + 0x38))[local_160._0_8_ + 1];
                  puVar25 = puVar11 + uVar12;
                  puVar1 = puVar11 + uVar13;
                  puVar26 = puVar25;
                  if (((uVar12 != uVar13) && (*puVar25 < (ulong)local_160._8_8_)) &&
                     (puVar26 = puVar1, (ulong)local_160._8_8_ <= puVar1[-1])) {
                    puVar26 = puVar25;
                    uVar23 = (long)(uVar13 * 8 + uVar12 * -8) >> 3;
                    while (uVar22 = uVar23, 0 < (long)uVar22) {
                      uVar23 = uVar22 >> 1;
                      if (puVar26[uVar23] < (ulong)local_160._8_8_) {
                        puVar26 = puVar26 + uVar23 + 1;
                        uVar23 = ~uVar23 + uVar22;
                      }
                    }
                  }
                  if (puVar26 == puVar1) {
                    puVar25 = (ulong *)0x0;
                  }
                  else {
                    if (*puVar26 != local_160._8_8_) goto LAB_0035e612;
                    puVar25 = (ulong *)(((long)puVar26 - (long)puVar11) +
                                       (long)*(pointer *)(local_170._0_8_ + 0x68));
                  }
                }
                else {
LAB_0035e612:
                  puVar25 = (ulong *)0x0;
                }
                if (puVar25 == (ulong *)0x0) {
                  puVar25 = &boost::numeric::ublas::
                             compressed_matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
                             ::zero_;
                }
              }
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *puVar25;
              auVar30 = vfmadd231sd_fma(auVar36,auVar30,auVar5);
              auVar38 = ZEXT1664(auVar30);
              if (local_170._8_4_ == 1) {
                local_160._24_8_ = local_160._24_8_ + 8;
              }
              else {
                local_160._8_8_ = local_160._8_8_ + 1;
              }
            }
            pQVar8 = (((QTables *)(local_160._32_8_ + 0x20))->
                     super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = local_120;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_a0;
            auVar30 = vfmadd132sd_fma(auVar36,auVar33,auVar6);
            (pQVar8->super_matrix_t).data_.data_
            [(pQVar8->super_matrix_t).size2_ * local_118 + (long)local_130] = auVar30._0_8_;
            if (uVar17 == 1) {
              uVar27 = uVar18 - (long)*(pointer *)(this_01 + 0x38) >> 3;
            }
            auVar16._8_8_ = 0x7fffffffffffffff;
            auVar16._0_8_ = 0x7fffffffffffffff;
            auVar34._8_8_ = 0;
            auVar34._0_8_ =
                 pdStack_b0[local_118 * local_d8._16_8_ + (long)local_130] - auVar30._0_8_;
            auVar30 = vandpd_avx512vl(auVar34,auVar16);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = local_138;
            auVar30 = vmaxsd_avx(auVar30,auVar37);
            local_138 = auVar30._0_8_;
            uVar27 = uVar27 + 1;
          } while (uVar17 != 1);
          boost::numeric::ublas::
          compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::find1((const_iterator1 *)local_170,
                  (compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)this_01,1,uVar27,local_e8,1);
        } while( true );
      }
      bVar29 = false;
LAB_0035e732:
      local_170._0_8_ = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Iteration","");
      TimedAlgorithm::StopTimer(local_128,(string *)local_170);
      if ((undefined1 *)local_170._0_8_ != local_160) {
        operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
      }
    } while (bVar29);
    if (A != 0.0) {
      dVar21 = 0.0;
      dVar31 = 4.94065645841247e-324;
      do {
        pvVar14 = *(void **)((long)local_108 + (long)dVar21 * 8);
        if (pvVar14 != (void *)0x0) {
          if (*(long *)((long)pvVar14 + 0x60) != 0) {
            operator_delete(*(void **)((long)pvVar14 + 0x68),*(long *)((long)pvVar14 + 0x60) << 3);
          }
          if (*(long *)((long)pvVar14 + 0x48) != 0) {
            operator_delete(*(void **)((long)pvVar14 + 0x50),*(long *)((long)pvVar14 + 0x48) << 3);
          }
          if (*(long *)((long)pvVar14 + 0x30) != 0) {
            operator_delete(*(void **)((long)pvVar14 + 0x38),*(long *)((long)pvVar14 + 0x30) << 3);
          }
          operator_delete(pvVar14,0x70);
        }
        bVar29 = A != dVar31;
        dVar21 = dVar31;
        dVar31 = (double)(ulong)(SUB84(dVar31,0) + 1);
      } while (bVar29);
    }
    if (local_108 != (void *)0x0) {
      operator_delete(local_108,(long)local_f8 - (long)local_108);
    }
    if (local_b8 != 0) {
      operator_delete(pdStack_b0,local_b8 << 3);
    }
  }
  else {
    local_138 = (double)((long)local_120 - 1);
    local_120 = local_138;
    do {
      dVar21 = local_138;
      if (S != 0) {
        uVar27 = 0;
        do {
          if (A != 0.0) {
            dVar31 = 0.0;
            do {
              local_130 = local_90.super_matrix_t.data_.data_
                          [local_90.super_matrix_t.size2_ * uVar27 + (long)dVar31];
              dVar32 = 0.0;
              auVar30 = ZEXT816(0);
              if ((ulong)local_138 < (ulong)local_120) {
                uVar23 = 0;
                do {
                  local_110 = auVar30._0_8_;
                  pQVar8 = (((QTables *)(local_160._32_8_ + 0x20))->
                           super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar22 = 0;
                  auVar30 = ZEXT816(0xffefffffffffffff);
                  do {
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = pQVar8[(long)dVar21 + 1].super_matrix_t.data_.data_
                                   [uVar23 * pQVar8[(long)dVar21 + 1].super_matrix_t.size2_ + uVar22
                                   ];
                    auVar30 = vmaxsd_avx(auVar30,auVar2);
                    uVar22 = uVar22 + 1;
                  } while ((uVar22 & 0xffffffff) < (ulong)A);
                  local_118 = auVar30._0_8_;
                  pMVar9 = (((MDPSolver *)local_160._32_8_)->_m_pu->super_PlanningUnitMADPDiscrete).
                           _m_madp;
                  auVar38._0_8_ = (**(code **)((long)*pMVar9 + 0x108))(pMVar9,uVar27,dVar31,uVar23);
                  auVar38._8_56_ = extraout_var;
                  auVar35._8_8_ = 0;
                  auVar35._0_8_ = local_110;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = local_118;
                  auVar30 = vfmadd231sd_fma(auVar35,auVar38._0_16_,auVar3);
                  dVar32 = auVar30._0_8_;
                  uVar23 = (ulong)((int)uVar23 + 1);
                } while (uVar23 < S);
              }
              pQVar8 = (((QTables *)(local_160._32_8_ + 0x20))->
                       super__Vector_base<QTable,_std::allocator<QTable>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pQVar8[(long)dVar21].super_matrix_t.data_.data_
              [pQVar8[(long)dVar21].super_matrix_t.size2_ * uVar27 + (long)dVar31] =
                   dVar32 + local_130;
              dVar31 = (double)(ulong)(SUB84(dVar31,0) + 1);
            } while ((ulong)dVar31 < (ulong)A);
          }
          uVar27 = (ulong)((int)uVar27 + 1);
        } while (uVar27 < S);
      }
      bVar29 = local_138 != 0.0;
      local_138 = (double)((long)local_138 - 1);
    } while (bVar29);
  }
  local_170._0_8_ = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Plan","");
  TimedAlgorithm::StopTimer(local_128,(string *)local_170);
  if ((undefined1 *)local_170._0_8_ != local_160) {
    operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
  }
  if (local_90.super_matrix_t.data_.size_ != 0) {
    operator_delete(local_90.super_matrix_t.data_.data_,local_90.super_matrix_t.data_.size_ << 3);
  }
  return;
}

Assistant:

void MDPValueIteration::PlanSlow()
{
    if(!_m_initialized)
        Initialize();

    StartTimer("Plan");

    size_t horizon = GetPU()->GetHorizon();
    size_t nrS = GetPU()->GetNrStates();
    size_t nrJA =  GetPU()->GetNrJointActions();

    double R_i,R_f,maxQsuc;

    // cache immediate reward for speed
    QTable immReward(nrS,nrJA);
    for(Index sI = 0; sI < nrS; sI++)
        for(Index jaI = 0; jaI < nrJA; jaI++)
            immReward(sI,jaI)=GetPU()->GetReward(sI, jaI);

   
    if(_m_finiteHorizon)
    {
        for(size_t t = horizon - 1; true; t--)
        {
            for(Index sI = 0; sI < nrS; sI++)
            {
                for(Index jaI = 0; jaI < nrJA; jaI++)
                {
                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    if(t < horizon - 1)
                    {
                        //calc. expected future reward
                        for(Index ssucI = 0; ssucI < nrS; ssucI++)
                        {
                            //find the best action at ssucI
                            maxQsuc = -DBL_MAX;
                            for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                                maxQsuc = max( _m_QValues[t+1](ssucI,jasucI),
                                               maxQsuc);
                            
                            R_f += GetPU()->GetTransitionProbability(sI, jaI,
                                                                     ssucI)
                                * maxQsuc;
                        }//done calc. expected future reward
                    }
                    _m_QValues[t](sI,jaI) = R_i + R_f;
                }//end for jaI
            }//end for sI
            if(t == 0) //escape from (loop t is unsigned!)
                break;
        }
    }
    else // infinite horizon problem
    {
        double maxDelta=DBL_MAX;
        double gamma=GetPU()->GetDiscount();
        QTable oldQtable;

        // in infinite-horizon case, it is typically worth to cache
        // the transition model
        typedef boost::numeric::ublas::compressed_matrix<double> CMatrix;
        vector<CMatrix*> T;
        CMatrix *Ta;
        double p;
        for(unsigned int a=0;a!=nrJA;++a)
        {
#if DEBUG_MDPValueIteration
            PrintTimersSummary();
#endif
            StartTimer("CacheTransitionModel");
            Ta=new CMatrix(nrS,nrS);

            for(unsigned int s=0;s!=nrS;++s)
                for(unsigned int s1=0;s1!=nrS;++s1)
                {
                    p=GetPU()->GetTransitionProbability(s,a,s1);
                    if(p>0)
                        (*Ta)(s,s1)=p;
                }

            T.push_back(Ta);
            StopTimer("CacheTransitionModel");
        }

        Index sI,ssucI;
        while(maxDelta>1e-4)
        {
            StartTimer("Iteration");
            maxDelta=0;
            oldQtable=_m_QValues[0];
            for(Index jaI = 0; jaI < nrJA; jaI++)
            {
                for(CMatrix::const_iterator1 ri=T[jaI]->begin1();
                    ri!=T[jaI]->end1(); ++ri)
                {
                    sI=ri.index1();

                    //calc. expected immediate reward
                    R_i = immReward(sI,jaI);
                    R_f = 0.0;
                    //calc. expected future reward
                    
                    for (CMatrix::const_iterator2 ci = ri.begin();
                         ci != ri.end(); ++ci)
                    {
                        ssucI=ci.index2();

                        //find the best action at ssucI
                        maxQsuc = -DBL_MAX;
                        for(Index jasucI = 0; jasucI < nrJA; jasucI++)
                            maxQsuc = max( oldQtable(ssucI,jasucI),
                                           maxQsuc);
                            
                        R_f += *ci * maxQsuc;
                    }//done calc. expected future reward

                    _m_QValues[0](sI,jaI) = R_i + gamma*R_f;
                    maxDelta=max(maxDelta,abs(oldQtable(sI,jaI)-
                                              _m_QValues[0](sI,jaI)));
                }//end for jaI
            }//end for sI

            StopTimer("Iteration");

#if DEBUG_MDPValueIteration
            cout << "delta " << maxDelta << endl;
            PrintTimersSummary();
#endif
        }

        for(unsigned int a=0;a!=nrJA;++a)
            delete T[a];
    }

    StopTimer("Plan");

#if DEBUG_MDPValueIteration
    PrintTimersSummary();
#endif
}